

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O1

bool __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::noViols(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *tol)

{
  cpp_dec_float<100U,_int,_void> *pcVar1;
  pointer pnVar2;
  bool bVar3;
  undefined8 uVar4;
  int iVar5;
  long lVar6;
  cpp_dec_float<100U,_int,_void> *pcVar7;
  long lVar8;
  long lVar9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<100U,_int,_void> local_88;
  
  iVar5 = (this->thecovectors->set).thenum;
  bVar3 = 0 < iVar5;
  if (this->theType == ENTER) {
    if (0 < iVar5) {
      lVar8 = 0;
      lVar9 = 0;
      do {
        pnVar2 = (this->theFvec->
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar1 = (cpp_dec_float<100U,_int,_void> *)((long)&pnVar2->m_backend + lVar8);
        pcVar7 = (cpp_dec_float<100U,_int,_void> *)
                 ((long)&(((this->theUBbound).val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + lVar8);
        local_88.fpclass = cpp_dec_float_finite;
        local_88.prec_elem = 0x10;
        local_88.data._M_elems[0] = 0;
        local_88.data._M_elems[1] = 0;
        local_88.data._M_elems[2] = 0;
        local_88.data._M_elems[3] = 0;
        local_88.data._M_elems[4] = 0;
        local_88.data._M_elems[5] = 0;
        local_88.data._M_elems[6] = 0;
        local_88.data._M_elems[7] = 0;
        local_88.data._M_elems[8] = 0;
        local_88.data._M_elems[9] = 0;
        local_88.data._M_elems[10] = 0;
        local_88.data._M_elems[0xb] = 0;
        local_88.data._M_elems[0xc] = 0;
        local_88.data._M_elems[0xd] = 0;
        local_88.data._M_elems._56_5_ = 0;
        local_88.data._M_elems[0xf]._1_3_ = 0;
        local_88.exp = 0;
        local_88.neg = false;
        if (pcVar7 == &local_88) {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    (&local_88,pcVar1);
          if (local_88.data._M_elems[0] != 0 || local_88.fpclass != cpp_dec_float_finite) {
            local_88.neg = (bool)(local_88.neg ^ 1);
          }
        }
        else {
          if (pcVar1 != &local_88) {
            local_88.data._M_elems._0_8_ = *(undefined8 *)(pcVar1->data)._M_elems;
            local_88.data._M_elems._8_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 2);
            local_88.data._M_elems._16_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 4);
            local_88.data._M_elems._24_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 6);
            local_88.data._M_elems._32_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 8);
            local_88.data._M_elems._40_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 10);
            local_88.data._M_elems._48_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 0xc);
            uVar4 = *(undefined8 *)((pcVar1->data)._M_elems + 0xe);
            local_88.data._M_elems._56_5_ = SUB85(uVar4,0);
            local_88.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
            local_88.exp = *(int *)((long)&pnVar2->m_backend + lVar8 + 0x40);
            local_88.neg = *(bool *)((long)&pnVar2->m_backend + lVar8 + 0x44);
            local_88._72_8_ = *(undefined8 *)((long)&pnVar2->m_backend + lVar8 + 0x48);
          }
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    (&local_88,pcVar7);
        }
        if (((local_88.fpclass != cpp_dec_float_NaN) &&
            ((tol->m_backend).fpclass != cpp_dec_float_NaN)) &&
           (iVar5 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                              (&local_88,&tol->m_backend), 0 < iVar5)) goto LAB_0039e3ae;
        pnVar2 = (this->theLBbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar1 = (cpp_dec_float<100U,_int,_void> *)((long)&(pnVar2->m_backend).data + lVar8);
        pcVar7 = (cpp_dec_float<100U,_int,_void> *)
                 ((long)&((this->theFvec->
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_backend + lVar8);
        local_88.fpclass = cpp_dec_float_finite;
        local_88.prec_elem = 0x10;
        local_88.data._M_elems[0] = 0;
        local_88.data._M_elems[1] = 0;
        local_88.data._M_elems[2] = 0;
        local_88.data._M_elems[3] = 0;
        local_88.data._M_elems[4] = 0;
        local_88.data._M_elems[5] = 0;
        local_88.data._M_elems[6] = 0;
        local_88.data._M_elems[7] = 0;
        local_88.data._M_elems[8] = 0;
        local_88.data._M_elems[9] = 0;
        local_88.data._M_elems[10] = 0;
        local_88.data._M_elems[0xb] = 0;
        local_88.data._M_elems[0xc] = 0;
        local_88.data._M_elems[0xd] = 0;
        local_88.data._M_elems._56_5_ = 0;
        local_88.data._M_elems[0xf]._1_3_ = 0;
        local_88.exp = 0;
        local_88.neg = false;
        if (pcVar7 == &local_88) {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    (&local_88,pcVar1);
          if (local_88.data._M_elems[0] != 0 || local_88.fpclass != cpp_dec_float_finite) {
            local_88.neg = (bool)(local_88.neg ^ 1);
          }
        }
        else {
          if (pcVar1 != &local_88) {
            local_88.data._M_elems._0_8_ = *(undefined8 *)(pcVar1->data)._M_elems;
            local_88.data._M_elems._8_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 2);
            local_88.data._M_elems._16_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 4);
            local_88.data._M_elems._24_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 6);
            local_88.data._M_elems._32_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 8);
            local_88.data._M_elems._40_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 10);
            local_88.data._M_elems._48_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 0xc);
            uVar4 = *(undefined8 *)((pcVar1->data)._M_elems + 0xe);
            local_88.data._M_elems._56_5_ = SUB85(uVar4,0);
            local_88.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
            local_88.exp = *(int *)((long)&(pnVar2->m_backend).data + lVar8 + 0x40);
            local_88.neg = *(bool *)((long)&(pnVar2->m_backend).data + lVar8 + 0x44);
            local_88._72_8_ = *(undefined8 *)((long)&(pnVar2->m_backend).data + lVar8 + 0x48);
          }
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    (&local_88,pcVar7);
        }
        if (((local_88.fpclass != cpp_dec_float_NaN) &&
            ((tol->m_backend).fpclass != cpp_dec_float_NaN)) &&
           (iVar5 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                              (&local_88,&tol->m_backend), 0 < iVar5)) goto LAB_0039e3ae;
        lVar9 = lVar9 + 1;
        lVar6 = (long)(this->thecovectors->set).thenum;
        lVar8 = lVar8 + 0x50;
        bVar3 = lVar9 < lVar6;
      } while (lVar9 < lVar6);
    }
  }
  else {
    if (0 < iVar5) {
      lVar9 = 0;
      lVar8 = 0;
      do {
        pnVar2 = (this->theCoPvec->
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar1 = (cpp_dec_float<100U,_int,_void> *)((long)&pnVar2->m_backend + lVar9);
        pcVar7 = (cpp_dec_float<100U,_int,_void> *)
                 ((long)&(((this->theCoUbound->val).
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + lVar9);
        local_88.fpclass = cpp_dec_float_finite;
        local_88.prec_elem = 0x10;
        local_88.data._M_elems[0] = 0;
        local_88.data._M_elems[1] = 0;
        local_88.data._M_elems[2] = 0;
        local_88.data._M_elems[3] = 0;
        local_88.data._M_elems[4] = 0;
        local_88.data._M_elems[5] = 0;
        local_88.data._M_elems[6] = 0;
        local_88.data._M_elems[7] = 0;
        local_88.data._M_elems[8] = 0;
        local_88.data._M_elems[9] = 0;
        local_88.data._M_elems[10] = 0;
        local_88.data._M_elems[0xb] = 0;
        local_88.data._M_elems[0xc] = 0;
        local_88.data._M_elems[0xd] = 0;
        local_88.data._M_elems._56_5_ = 0;
        local_88.data._M_elems[0xf]._1_3_ = 0;
        local_88.exp = 0;
        local_88.neg = false;
        if (pcVar7 == &local_88) {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    (&local_88,pcVar1);
          if (local_88.data._M_elems[0] != 0 || local_88.fpclass != cpp_dec_float_finite) {
            local_88.neg = (bool)(local_88.neg ^ 1);
          }
        }
        else {
          if (pcVar1 != &local_88) {
            local_88.data._M_elems._0_8_ = *(undefined8 *)(pcVar1->data)._M_elems;
            local_88.data._M_elems._8_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 2);
            local_88.data._M_elems._16_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 4);
            local_88.data._M_elems._24_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 6);
            local_88.data._M_elems._32_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 8);
            local_88.data._M_elems._40_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 10);
            local_88.data._M_elems._48_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 0xc);
            uVar4 = *(undefined8 *)((pcVar1->data)._M_elems + 0xe);
            local_88.data._M_elems._56_5_ = SUB85(uVar4,0);
            local_88.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
            local_88.exp = *(int *)((long)&pnVar2->m_backend + lVar9 + 0x40);
            local_88.neg = *(bool *)((long)&pnVar2->m_backend + lVar9 + 0x44);
            local_88._72_8_ = *(undefined8 *)((long)&pnVar2->m_backend + lVar9 + 0x48);
          }
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    (&local_88,pcVar7);
        }
        if (((local_88.fpclass != cpp_dec_float_NaN) &&
            ((tol->m_backend).fpclass != cpp_dec_float_NaN)) &&
           (iVar5 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                              (&local_88,&tol->m_backend), 0 < iVar5)) {
LAB_0039e1c1:
          if (bVar3) {
            return false;
          }
          break;
        }
        pnVar2 = (this->theCoLbound->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar1 = (cpp_dec_float<100U,_int,_void> *)((long)&(pnVar2->m_backend).data + lVar9);
        pcVar7 = (cpp_dec_float<100U,_int,_void> *)
                 ((long)&((this->theCoPvec->
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_backend + lVar9);
        local_88.fpclass = cpp_dec_float_finite;
        local_88.prec_elem = 0x10;
        local_88.data._M_elems[0] = 0;
        local_88.data._M_elems[1] = 0;
        local_88.data._M_elems[2] = 0;
        local_88.data._M_elems[3] = 0;
        local_88.data._M_elems[4] = 0;
        local_88.data._M_elems[5] = 0;
        local_88.data._M_elems[6] = 0;
        local_88.data._M_elems[7] = 0;
        local_88.data._M_elems[8] = 0;
        local_88.data._M_elems[9] = 0;
        local_88.data._M_elems[10] = 0;
        local_88.data._M_elems[0xb] = 0;
        local_88.data._M_elems[0xc] = 0;
        local_88.data._M_elems[0xd] = 0;
        local_88.data._M_elems._56_5_ = 0;
        local_88.data._M_elems[0xf]._1_3_ = 0;
        local_88.exp = 0;
        local_88.neg = false;
        if (pcVar7 == &local_88) {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    (&local_88,pcVar1);
          if (local_88.data._M_elems[0] != 0 || local_88.fpclass != cpp_dec_float_finite) {
            local_88.neg = (bool)(local_88.neg ^ 1);
          }
        }
        else {
          if (pcVar1 != &local_88) {
            local_88.data._M_elems._0_8_ = *(undefined8 *)(pcVar1->data)._M_elems;
            local_88.data._M_elems._8_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 2);
            local_88.data._M_elems._16_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 4);
            local_88.data._M_elems._24_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 6);
            local_88.data._M_elems._32_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 8);
            local_88.data._M_elems._40_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 10);
            local_88.data._M_elems._48_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 0xc);
            uVar4 = *(undefined8 *)((pcVar1->data)._M_elems + 0xe);
            local_88.data._M_elems._56_5_ = SUB85(uVar4,0);
            local_88.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
            local_88.exp = *(int *)((long)&(pnVar2->m_backend).data + lVar9 + 0x40);
            local_88.neg = *(bool *)((long)&(pnVar2->m_backend).data + lVar9 + 0x44);
            local_88._72_8_ = *(undefined8 *)((long)&(pnVar2->m_backend).data + lVar9 + 0x48);
          }
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    (&local_88,pcVar7);
        }
        if (((local_88.fpclass != cpp_dec_float_NaN) &&
            ((tol->m_backend).fpclass != cpp_dec_float_NaN)) &&
           (iVar5 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                              (&local_88,&tol->m_backend), 0 < iVar5)) goto LAB_0039e1c1;
        lVar8 = lVar8 + 1;
        lVar6 = (long)(this->thecovectors->set).thenum;
        lVar9 = lVar9 + 0x50;
        bVar3 = lVar8 < lVar6;
      } while (lVar8 < lVar6);
    }
    iVar5 = (this->thevectors->set).thenum;
    bVar3 = 0 < iVar5;
    if (0 < iVar5) {
      lVar9 = 0;
      lVar8 = 0;
      do {
        pnVar2 = (this->thePvec->
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar1 = (cpp_dec_float<100U,_int,_void> *)((long)&pnVar2->m_backend + lVar9);
        pcVar7 = (cpp_dec_float<100U,_int,_void> *)
                 ((long)&(((this->theUbound->val).
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + lVar9);
        local_88.fpclass = cpp_dec_float_finite;
        local_88.prec_elem = 0x10;
        local_88.data._M_elems[0] = 0;
        local_88.data._M_elems[1] = 0;
        local_88.data._M_elems[2] = 0;
        local_88.data._M_elems[3] = 0;
        local_88.data._M_elems[4] = 0;
        local_88.data._M_elems[5] = 0;
        local_88.data._M_elems[6] = 0;
        local_88.data._M_elems[7] = 0;
        local_88.data._M_elems[8] = 0;
        local_88.data._M_elems[9] = 0;
        local_88.data._M_elems[10] = 0;
        local_88.data._M_elems[0xb] = 0;
        local_88.data._M_elems[0xc] = 0;
        local_88.data._M_elems[0xd] = 0;
        local_88.data._M_elems._56_5_ = 0;
        local_88.data._M_elems[0xf]._1_3_ = 0;
        local_88.exp = 0;
        local_88.neg = false;
        if (pcVar7 == &local_88) {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    (&local_88,pcVar1);
          if (local_88.data._M_elems[0] != 0 || local_88.fpclass != cpp_dec_float_finite) {
            local_88.neg = (bool)(local_88.neg ^ 1);
          }
        }
        else {
          if (pcVar1 != &local_88) {
            local_88.data._M_elems._0_8_ = *(undefined8 *)(pcVar1->data)._M_elems;
            local_88.data._M_elems._8_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 2);
            local_88.data._M_elems._16_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 4);
            local_88.data._M_elems._24_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 6);
            local_88.data._M_elems._32_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 8);
            local_88.data._M_elems._40_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 10);
            local_88.data._M_elems._48_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 0xc);
            uVar4 = *(undefined8 *)((pcVar1->data)._M_elems + 0xe);
            local_88.data._M_elems._56_5_ = SUB85(uVar4,0);
            local_88.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
            local_88.exp = *(int *)((long)&pnVar2->m_backend + lVar9 + 0x40);
            local_88.neg = *(bool *)((long)&pnVar2->m_backend + lVar9 + 0x44);
            local_88._72_8_ = *(undefined8 *)((long)&pnVar2->m_backend + lVar9 + 0x48);
          }
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    (&local_88,pcVar7);
        }
        if (((local_88.fpclass != cpp_dec_float_NaN) &&
            ((tol->m_backend).fpclass != cpp_dec_float_NaN)) &&
           (iVar5 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                              (&local_88,&tol->m_backend), 0 < iVar5)) {
LAB_0039e3ae:
          if (!bVar3) {
            return true;
          }
          return false;
        }
        pnVar2 = (this->theLbound->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar1 = (cpp_dec_float<100U,_int,_void> *)((long)&(pnVar2->m_backend).data + lVar9);
        pcVar7 = (cpp_dec_float<100U,_int,_void> *)
                 ((long)&((this->thePvec->
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_backend + lVar9);
        local_88.fpclass = cpp_dec_float_finite;
        local_88.prec_elem = 0x10;
        local_88.data._M_elems[0] = 0;
        local_88.data._M_elems[1] = 0;
        local_88.data._M_elems[2] = 0;
        local_88.data._M_elems[3] = 0;
        local_88.data._M_elems[4] = 0;
        local_88.data._M_elems[5] = 0;
        local_88.data._M_elems[6] = 0;
        local_88.data._M_elems[7] = 0;
        local_88.data._M_elems[8] = 0;
        local_88.data._M_elems[9] = 0;
        local_88.data._M_elems[10] = 0;
        local_88.data._M_elems[0xb] = 0;
        local_88.data._M_elems[0xc] = 0;
        local_88.data._M_elems[0xd] = 0;
        local_88.data._M_elems._56_5_ = 0;
        local_88.data._M_elems[0xf]._1_3_ = 0;
        local_88.exp = 0;
        local_88.neg = false;
        if (pcVar7 == &local_88) {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    (&local_88,pcVar1);
          if (local_88.data._M_elems[0] != 0 || local_88.fpclass != cpp_dec_float_finite) {
            local_88.neg = (bool)(local_88.neg ^ 1);
          }
        }
        else {
          if (pcVar1 != &local_88) {
            local_88.data._M_elems._0_8_ = *(undefined8 *)(pcVar1->data)._M_elems;
            local_88.data._M_elems._8_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 2);
            local_88.data._M_elems._16_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 4);
            local_88.data._M_elems._24_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 6);
            local_88.data._M_elems._32_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 8);
            local_88.data._M_elems._40_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 10);
            local_88.data._M_elems._48_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 0xc);
            uVar4 = *(undefined8 *)((pcVar1->data)._M_elems + 0xe);
            local_88.data._M_elems._56_5_ = SUB85(uVar4,0);
            local_88.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
            local_88.exp = *(int *)((long)&(pnVar2->m_backend).data + lVar9 + 0x40);
            local_88.neg = *(bool *)((long)&(pnVar2->m_backend).data + lVar9 + 0x44);
            local_88._72_8_ = *(undefined8 *)((long)&(pnVar2->m_backend).data + lVar9 + 0x48);
          }
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    (&local_88,pcVar7);
        }
        if (((local_88.fpclass != cpp_dec_float_NaN) &&
            ((tol->m_backend).fpclass != cpp_dec_float_NaN)) &&
           (iVar5 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                              (&local_88,&tol->m_backend), 0 < iVar5)) goto LAB_0039e3ae;
        lVar8 = lVar8 + 1;
        lVar6 = (long)(this->thevectors->set).thenum;
        lVar9 = lVar9 + 0x50;
        bVar3 = lVar8 < lVar6;
      } while (lVar8 < lVar6);
    }
  }
  return true;
}

Assistant:

bool SPxSolverBase<R>::noViols(R tol) const
   {
      assert(tol >= R(0.0));

      if(type() == ENTER)
      {
         for(int i = 0; i < dim(); i++)
         {
            if((*theFvec)[i] - theUBbound[i] > tol)
               return false;

            if(theLBbound[i] - (*theFvec)[i] > tol)
               return false;
         }
      }
      else
      {
         assert(type() == LEAVE);

         for(int i = 0; i < dim(); i++)
         {
            if((*theCoPvec)[i] - (*theCoUbound)[i] > tol)
               return false;

            if((*theCoLbound)[i] - (*theCoPvec)[i] > tol)
               return false;
         }

         for(int i = 0; i < coDim(); i++)
         {
            if((*thePvec)[i] - (*theUbound)[i] > tol)
               return false;

            if((*theLbound)[i] - (*thePvec)[i] > tol)
               return false;
         }
      }

      return true;
   }